

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

bool __thiscall
units::uncertain_measurement::operator==(uncertain_measurement *this,measurement *other)

{
  float val1;
  float fVar1;
  bool bVar2;
  double dVar3;
  byte bVar4;
  float val2;
  
  dVar3 = measurement::value_as(other,&this->units_);
  val2 = (float)dVar3;
  val1 = this->value_;
  fVar1 = this->uncertainty_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    bVar4 = -(val2 <= fVar1 + val1) & -(val1 - fVar1 <= val2);
  }
  else {
    bVar4 = 1;
    if ((val1 != val2) || (NAN(val1) || NAN(val2))) {
      bVar2 = detail::compare_round_equals(val1,val2);
      return bVar2;
    }
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool operator==(const measurement& other) const
    {
        auto val = static_cast<float>(other.value_as(units_));
        if (uncertainty_ == 0.0F) {
            return (value_ == val) ? true :
                                     detail::compare_round_equals(value_, val);
        }
        return (
            val >= (value_ - uncertainty_) && val <= (value_ + uncertainty_));
    }